

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O0

bool __thiscall
kmp_flag_64::wait_cancellable_nosleep
          (kmp_flag_64 *this,kmp_info_t *this_thr,int final_spin,void *itt_sync_obj)

{
  int in_EDX;
  bool retval;
  void *in_stack_00000068;
  kmp_flag_64 *in_stack_00000070;
  kmp_info_t *in_stack_00000078;
  undefined1 local_21;
  
  if (in_EDX == 0) {
    local_21 = __kmp_wait_template<kmp_flag_64,0,true,false>
                         (in_stack_00000078,in_stack_00000070,in_stack_00000068);
  }
  else {
    local_21 = __kmp_wait_template<kmp_flag_64,1,true,false>
                         (in_stack_00000078,in_stack_00000070,in_stack_00000068);
  }
  return local_21;
}

Assistant:

bool wait_cancellable_nosleep(kmp_info_t *this_thr,
                                int final_spin
                                    USE_ITT_BUILD_ARG(void *itt_sync_obj)) {
    bool retval = false;
    if (final_spin)
      retval = __kmp_wait_template<kmp_flag_64, TRUE, true, false>(
          this_thr, this USE_ITT_BUILD_ARG(itt_sync_obj));
    else
      retval = __kmp_wait_template<kmp_flag_64, FALSE, true, false>(
          this_thr, this USE_ITT_BUILD_ARG(itt_sync_obj));
    return retval;
  }